

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

IStream * Json::operator>>(IStream *sin,Value *root)

{
  bool bVar1;
  String errs;
  CharReaderBuilder b;
  String local_70;
  CharReaderBuilder local_50;
  
  CharReaderBuilder::CharReaderBuilder(&local_50);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar1 = parseFromStream(&local_50.super_Factory,sin,root,&local_70);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    local_50.super_Factory._vptr_Factory = (_func_int **)&PTR__CharReaderBuilder_00868060;
    Value::~Value(&local_50.settings_);
    return sin;
  }
  throwRuntimeError(&local_70);
}

Assistant:

IStream& operator>>(IStream& sin, Value& root) {
  CharReaderBuilder b;
  String errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    throwRuntimeError(errs);
  }
  return sin;
}